

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O2

void __thiscall
gmath::RadialDistortion::getProperties(RadialDistortion *this,Properties *prop,int id)

{
  int in_ECX;
  undefined4 in_register_00000014;
  string local_40;
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k1",(char *)CONCAT44(in_register_00000014,id),
             in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k2",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 1);
  std::__cxx11::string::~string((string *)&local_40);
  (anonymous_namespace)::getCameraKey_abi_cxx11_
            (&local_40,(_anonymous_namespace_ *)"k3",(char *)(ulong)(uint)id,in_ECX);
  gutil::Properties::putValue<double>(prop,local_40._M_dataplus._M_p,this->kd + 2);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void RadialDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("k1", id).c_str(), kd[0]);
  prop.putValue(getCameraKey("k2", id).c_str(), kd[1]);
  prop.putValue(getCameraKey("k3", id).c_str(), kd[2]);
}